

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O1

void __thiscall File::~File(File *this)

{
  Tag *this_00;
  uint uVar1;
  pointer ppTVar2;
  ulong uVar3;
  
  this->_vptr_File = (_func_int **)&PTR_load_0010aba8;
  ppTVar2 = (this->_tags).super__Vector_base<Tag_*,_std::allocator<Tag_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->_tags).super__Vector_base<Tag_*,_std::allocator<Tag_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppTVar2) {
    uVar1 = 1;
    uVar3 = 0;
    do {
      this_00 = ppTVar2[uVar3];
      if (this_00 != (Tag *)0x0) {
        Tag::~Tag(this_00);
        operator_delete(this_00,0x60);
        (this->_tags).super__Vector_base<Tag_*,_std::allocator<Tag_*>_>._M_impl.
        super__Vector_impl_data._M_start[uVar3] = (Tag *)0x0;
      }
      uVar3 = (ulong)uVar1;
      ppTVar2 = (this->_tags).super__Vector_base<Tag_*,_std::allocator<Tag_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar1 = uVar1 + 1;
    } while (uVar3 < (ulong)((long)(this->_tags).super__Vector_base<Tag_*,_std::allocator<Tag_*>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)ppTVar2 >> 3));
  }
  if (ppTVar2 != (pointer)0x0) {
    operator_delete(ppTVar2,(long)(this->_tags).super__Vector_base<Tag_*,_std::allocator<Tag_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppTVar2)
    ;
    return;
  }
  return;
}

Assistant:

File::~File()
{
	for ( unsigned int i = 0; i < _tags.size();i++ )
	{
		if ( _tags[i] != NULL )
		{
			delete _tags[i];
			_tags[i] = NULL;
		}
	}
}